

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O1

void __thiscall
ncnn::MultiHeadAttention_x86_avx512::destroy_pipeline(MultiHeadAttention_x86_avx512 *this)

{
  Option *in_RSI;
  
  destroy_pipeline((MultiHeadAttention_x86_avx512 *)
                   ((long)&this->_vptr_MultiHeadAttention_x86_avx512 +
                   (long)this->_vptr_MultiHeadAttention_x86_avx512[-7]),in_RSI);
  return;
}

Assistant:

int MultiHeadAttention_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (q_gemm)
    {
        q_gemm->destroy_pipeline(opt);
        delete q_gemm;
        q_gemm = 0;
    }

    if (k_gemm)
    {
        k_gemm->destroy_pipeline(opt);
        delete k_gemm;
        k_gemm = 0;
    }

    if (v_gemm)
    {
        v_gemm->destroy_pipeline(opt);
        delete v_gemm;
        v_gemm = 0;
    }

    if (qk_gemm)
    {
        qk_gemm->destroy_pipeline(opt);
        delete qk_gemm;
        qk_gemm = 0;
    }
    if (qkv_gemm)
    {
        qkv_gemm->destroy_pipeline(opt);
        delete qkv_gemm;
        qkv_gemm = 0;
    }

    if (qk_softmax)
    {
        qk_softmax->destroy_pipeline(opt);
        delete qk_softmax;
        qk_softmax = 0;
    }

    if (o_gemm)
    {
        o_gemm->destroy_pipeline(opt);
        delete o_gemm;
        o_gemm = 0;
    }

    return 0;
}